

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

bool __thiscall pstore::command_line::option::can_accept_another_occurrence(option *this)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = (*this->_vptr_option[3])();
  if ((uVar1 & 0xfffffffd) == 0) {
    bVar2 = this->num_occurrences_ == 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool option::can_accept_another_occurrence () const {
                bool result = true;
                switch (this->get_num_occurrences_flag ()) {
                case num_occurrences_flag::optional:
                case num_occurrences_flag::required: result = num_occurrences_ == 0U; break;
                case num_occurrences_flag::zero_or_more:
                case num_occurrences_flag::one_or_more: break;
                }
                return result;
            }